

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateRepeatedMessageField
          (FieldGenerator *this,Printer *printer)

{
  Printer *printer_00;
  FieldDescriptor *pFVar1;
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  initializer_list<google::protobuf::io::Printer::Sub> v_01;
  initializer_list<google::protobuf::io::Printer::Sub> v_02;
  initializer_list<google::protobuf::io::Printer::Sub> v_03;
  initializer_list<google::protobuf::io::Printer::Sub> v_04;
  undefined8 uVar2;
  Options *pOVar3;
  undefined1 in_R8B;
  Sub *local_b50;
  Sub *local_b10;
  Sub *local_ad0;
  Sub *local_a90;
  Sub *local_a50;
  Sub *local_a10;
  basic_string_view<char,_std::char_traits<char>_> local_9a8;
  undefined1 local_991;
  anon_class_8_1_55a613f1_for_cb local_990;
  allocator<char> local_981;
  string local_980;
  Sub *local_960;
  Sub local_958;
  iterator local_8a0;
  size_type local_898;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_890;
  Options local_880;
  basic_string_view<char,_std::char_traits<char>_> local_828;
  undefined1 local_811;
  anon_class_8_1_55a613f1_for_cb local_810;
  allocator<char> local_801;
  string local_800;
  Sub *local_7e0;
  Sub local_7d8;
  iterator local_720;
  size_type local_718;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_710;
  Options local_700;
  basic_string_view<char,_std::char_traits<char>_> local_6a8;
  undefined1 local_691;
  anon_class_8_1_55a613f1_for_cb local_690;
  allocator<char> local_681;
  string local_680;
  Sub *local_660;
  Sub local_658;
  iterator local_5a0;
  size_type local_598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_590;
  Options local_580;
  basic_string_view<char,_std::char_traits<char>_> local_528;
  undefined1 local_511;
  anon_class_8_1_55a613f1_for_cb local_510;
  allocator<char> local_501;
  string local_500;
  Sub *local_4e0;
  Sub local_4d8;
  iterator local_420;
  size_type local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_410;
  Options local_400;
  basic_string_view<char,_std::char_traits<char>_> local_3a8;
  undefined1 local_391;
  anon_class_8_1_55a613f1_for_cb local_390;
  allocator<char> local_381;
  string local_380;
  Sub *local_360;
  Sub local_358;
  iterator local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_290;
  Options local_280;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  undefined1 local_211;
  anon_class_8_1_55a613f1_for_cb local_210;
  allocator<char> local_201;
  string local_200;
  Sub *local_1e0;
  Sub local_1d8;
  iterator local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_110;
  Options local_100;
  undefined1 local_b0 [32];
  undefined1 local_90 [80];
  string_view local_40;
  undefined1 local_30 [8];
  JvmNameContext name_ctx;
  Printer *printer_local;
  FieldGenerator *this_local;
  
  name_ctx._16_8_ = printer;
  local_30 = (undefined1  [8])java::Context::options(this->context_);
  uVar2 = name_ctx._16_8_;
  name_ctx.options = (Options *)name_ctx._16_8_;
  name_ctx.printer._0_1_ = this->lite_ & 1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,
             "/**\n * An uninstantiable, behaviorless type to represent the field in\n * generics.\n */\n@kotlin.OptIn(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\npublic class ${$$kt_capitalized_name$Proxy$}$ private constructor() : com.google.protobuf.kotlin.DslProxy()\n"
            );
  io::Printer::Print<>((Printer *)uVar2,local_40);
  uVar2 = name_ctx._16_8_;
  printer_00 = (Printer *)this->descriptor_;
  pOVar3 = java::Context::options(this->context_);
  java::Options::Options((Options *)local_90,pOVar3);
  java::WriteFieldDocComment
            ((java *)uVar2,printer_00,(FieldDescriptor *)local_90,(Options *)0x1,(bool)in_R8B);
  java::Options::~Options((Options *)local_90);
  uVar2 = name_ctx._16_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_b0,
             "$kt_deprecation$ public val $kt_name$: com.google.protobuf.kotlin.DslList<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>\n$  jvm_synthetic$  get() = com.google.protobuf.kotlin.DslList(\n    $kt_dsl_builder$.${$$kt_property_name$List$}$\n  )\n"
            );
  io::Printer::Print<>((Printer *)uVar2,(string_view)local_b0._0_16_);
  uVar2 = name_ctx._16_8_;
  pFVar1 = this->descriptor_;
  pOVar3 = java::Context::options(this->context_);
  java::Options::Options(&local_100,pOVar3);
  java::WriteFieldAccessorDocComment((Printer *)uVar2,pFVar1,LIST_ADDER,&local_100,false,true,false)
  ;
  java::Options::~Options(&local_100);
  uVar2 = name_ctx._16_8_;
  local_211 = 1;
  local_1e0 = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"jvm_name",&local_201);
  local_210.name_ctx = (JvmNameContext *)local_30;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateRepeatedMessageField(google::protobuf::io::Printer*)const::__0>
            (&local_1d8,&local_200,&local_210);
  local_211 = 0;
  local_120 = &local_1d8;
  local_118 = 1;
  v_04._M_len = 1;
  v_04._M_array = local_120;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_110._M_local_buf,v_04);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_228,
             "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslList<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>.add(value: $kt_type$) {\n  $kt_dsl_builder$.${$add$capitalized_name$$}$(value)\n}\n"
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)uVar2,local_110._M_allocated_capacity,local_110._8_8_,
                    local_228._M_len);
  local_a10 = (Sub *)&local_120;
  do {
    local_a10 = local_a10 + -1;
    io::Printer::Sub::~Sub(local_a10);
  } while (local_a10 != &local_1d8);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  uVar2 = name_ctx._16_8_;
  pFVar1 = this->descriptor_;
  pOVar3 = java::Context::options(this->context_);
  java::Options::Options(&local_280,pOVar3);
  java::WriteFieldAccessorDocComment((Printer *)uVar2,pFVar1,LIST_ADDER,&local_280,false,true,false)
  ;
  java::Options::~Options(&local_280);
  uVar2 = name_ctx._16_8_;
  local_391 = 1;
  local_360 = &local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"jvm_name",&local_381);
  local_390.name_ctx = (JvmNameContext *)local_30;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateRepeatedMessageField(google::protobuf::io::Printer*)const::__1>
            (&local_358,&local_380,&local_390);
  local_391 = 0;
  local_2a0 = &local_358;
  local_298 = 1;
  v_03._M_len = 1;
  v_03._M_array = local_2a0;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_290._M_local_buf,v_03);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3a8,
             "$jvm_synthetic$$jvm_name$@Suppress(\"NOTHING_TO_INLINE\")\npublic inline operator fun com.google.protobuf.kotlin.DslList<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>.plusAssign(value: $kt_type$) {\n  add(value)\n}\n"
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)uVar2,local_290._M_allocated_capacity,local_290._8_8_,
                    local_3a8._M_len);
  local_a50 = (Sub *)&local_2a0;
  do {
    local_a50 = local_a50 + -1;
    io::Printer::Sub::~Sub(local_a50);
  } while (local_a50 != &local_358);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  uVar2 = name_ctx._16_8_;
  pFVar1 = this->descriptor_;
  pOVar3 = java::Context::options(this->context_);
  java::Options::Options(&local_400,pOVar3);
  java::WriteFieldAccessorDocComment
            ((Printer *)uVar2,pFVar1,LIST_MULTI_ADDER,&local_400,false,true,false);
  java::Options::~Options(&local_400);
  uVar2 = name_ctx._16_8_;
  local_511 = 1;
  local_4e0 = &local_4d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"jvm_name",&local_501);
  local_510.name_ctx = (JvmNameContext *)local_30;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateRepeatedMessageField(google::protobuf::io::Printer*)const::__2>
            (&local_4d8,&local_500,&local_510);
  local_511 = 0;
  local_420 = &local_4d8;
  local_418 = 1;
  v_02._M_len = 1;
  v_02._M_array = local_420;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_410._M_local_buf,v_02);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_528,
             "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslList<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>.addAll(values: kotlin.collections.Iterable<$kt_type$>) {\n  $kt_dsl_builder$.${$addAll$capitalized_name$$}$(values)\n}\n"
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)uVar2,local_410._M_allocated_capacity,local_410._8_8_,
                    local_528._M_len);
  local_a90 = (Sub *)&local_420;
  do {
    local_a90 = local_a90 + -1;
    io::Printer::Sub::~Sub(local_a90);
  } while (local_a90 != &local_4d8);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  uVar2 = name_ctx._16_8_;
  pFVar1 = this->descriptor_;
  pOVar3 = java::Context::options(this->context_);
  java::Options::Options(&local_580,pOVar3);
  java::WriteFieldAccessorDocComment
            ((Printer *)uVar2,pFVar1,LIST_MULTI_ADDER,&local_580,false,true,false);
  java::Options::~Options(&local_580);
  uVar2 = name_ctx._16_8_;
  local_691 = 1;
  local_660 = &local_658;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"jvm_name",&local_681);
  local_690.name_ctx = (JvmNameContext *)local_30;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateRepeatedMessageField(google::protobuf::io::Printer*)const::__3>
            (&local_658,&local_680,&local_690);
  local_691 = 0;
  local_5a0 = &local_658;
  local_598 = 1;
  v_01._M_len = 1;
  v_01._M_array = local_5a0;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_590._M_local_buf,v_01);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_6a8,
             "$jvm_synthetic$$jvm_name$@Suppress(\"NOTHING_TO_INLINE\")\npublic inline operator fun com.google.protobuf.kotlin.DslList<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>.plusAssign(values: kotlin.collections.Iterable<$kt_type$>) {\n  addAll(values)\n}\n"
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)uVar2,local_590._M_allocated_capacity,local_590._8_8_,
                    local_6a8._M_len);
  local_ad0 = (Sub *)&local_5a0;
  do {
    local_ad0 = local_ad0 + -1;
    io::Printer::Sub::~Sub(local_ad0);
  } while (local_ad0 != &local_658);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  uVar2 = name_ctx._16_8_;
  pFVar1 = this->descriptor_;
  pOVar3 = java::Context::options(this->context_);
  java::Options::Options(&local_700,pOVar3);
  java::WriteFieldAccessorDocComment
            ((Printer *)uVar2,pFVar1,LIST_INDEXED_SETTER,&local_700,false,true,false);
  java::Options::~Options(&local_700);
  uVar2 = name_ctx._16_8_;
  local_811 = 1;
  local_7e0 = &local_7d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_800,"jvm_name",&local_801);
  local_810.name_ctx = (JvmNameContext *)local_30;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateRepeatedMessageField(google::protobuf::io::Printer*)const::__4>
            (&local_7d8,&local_800,&local_810);
  local_811 = 0;
  local_720 = &local_7d8;
  local_718 = 1;
  v_00._M_len = 1;
  v_00._M_array = local_720;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_710._M_local_buf,v_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_828,
             "$jvm_synthetic$$jvm_name$public operator fun com.google.protobuf.kotlin.DslList<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>.set(index: kotlin.Int, value: $kt_type$) {\n  $kt_dsl_builder$.${$set$capitalized_name$$}$(index, value)\n}\n"
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)uVar2,local_710._M_allocated_capacity,local_710._8_8_,
                    local_828._M_len);
  local_b10 = (Sub *)&local_720;
  do {
    local_b10 = local_b10 + -1;
    io::Printer::Sub::~Sub(local_b10);
  } while (local_b10 != &local_7d8);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  uVar2 = name_ctx._16_8_;
  pFVar1 = this->descriptor_;
  pOVar3 = java::Context::options(this->context_);
  java::Options::Options(&local_880,pOVar3);
  java::WriteFieldAccessorDocComment((Printer *)uVar2,pFVar1,CLEARER,&local_880,false,true,false);
  java::Options::~Options(&local_880);
  uVar2 = name_ctx._16_8_;
  local_991 = 1;
  local_960 = &local_958;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"jvm_name",&local_981);
  local_990.name_ctx = (JvmNameContext *)local_30;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateRepeatedMessageField(google::protobuf::io::Printer*)const::__5>
            (&local_958,&local_980,&local_990);
  local_991 = 0;
  local_8a0 = &local_958;
  local_898 = 1;
  v._M_len = 1;
  v._M_array = local_8a0;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_890._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_9a8,
             "$jvm_synthetic$$jvm_name$public fun com.google.protobuf.kotlin.DslList<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>.clear() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}\n"
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)uVar2,local_890._M_allocated_capacity,local_890._8_8_,
                    local_9a8._M_len,local_9a8._M_str);
  local_b50 = (Sub *)&local_8a0;
  do {
    local_b50 = local_b50 + -1;
    io::Printer::Sub::~Sub(local_b50);
  } while (local_b50 != &local_958);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator(&local_981);
  return;
}

Assistant:

void FieldGenerator::GenerateRepeatedMessageField(io::Printer* printer) const {
  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  printer->Print(
      "/**\n"
      " * An uninstantiable, behaviorless type to represent the field in\n"
      " * generics.\n"
      " */\n"
      "@kotlin.OptIn"
      "(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n"
      "public class ${$$kt_capitalized_name$Proxy$}$ private constructor()"
      " : com.google.protobuf.kotlin.DslProxy()\n");

  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Print(
      "$kt_deprecation$ public val $kt_name$: "
      "com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>\n"
      "$  jvm_synthetic$"
      "  get() = com.google.protobuf.kotlin.DslList(\n"
      "    $kt_dsl_builder$.${$$kt_property_name$List$}$\n"
      "  )\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name", [&] { JvmName("add$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "add(value: $kt_type$) {\n"
      "  $kt_dsl_builder$.${$add$capitalized_name$$}$(value)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("plusAssign$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "plusAssign(value: $kt_type$) {\n"
      "  add(value)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_MULTI_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("addAll$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "addAll(values: kotlin.collections.Iterable<$kt_type$>) {\n"
      "  $kt_dsl_builder$.${$addAll$capitalized_name$$}$(values)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_MULTI_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("plusAssignAll$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "plusAssign(values: kotlin.collections.Iterable<$kt_type$>) {\n"
      "  addAll(values)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::LIST_INDEXED_SETTER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name", [&] { JvmName("set$kt_capitalized_name$", name_ctx); }},
      },
      "$jvm_synthetic$"
      "$jvm_name$"
      "public operator fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "set(index: kotlin.Int, value: $kt_type$) {\n"
      "  $kt_dsl_builder$.${$set$capitalized_name$$}$(index, value)\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name",
           [&] { JvmName("clear$kt_capitalized_name$", name_ctx); }},
      },

      "$jvm_synthetic$"
      "$jvm_name$"
      "public fun com.google.protobuf.kotlin.DslList"
      "<$kt_type$, ${$$kt_capitalized_name$Proxy$}$>."
      "clear() {\n"
      "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "}\n");
}